

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

void appendVariant(QCborContainerPrivate *d,QVariant *variant)

{
  int iVar1;
  char *data;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)QVariant::metaType(variant);
  iVar1 = QMetaType::registerHelper((QMetaType *)&local_38);
  if (iVar1 == 0xc) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVariant::toByteArray((QByteArray *)&local_38,variant);
    data = (char *)local_38.ptr;
    if (local_38.ptr == (char16_t *)0x0) {
      data = &QByteArray::_empty;
    }
    QCborContainerPrivate::appendByteData(d,data,local_38.size,ByteArray,(ValueFlags)0x0);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  }
  else if (iVar1 == 10) {
    QVariant::toString((QString *)&local_38,variant);
    QCborContainerPrivate::append(d,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  else {
    QCborValue::fromVariant((QCborValue *)&local_38,variant);
    QCborContainerPrivate::append(d,(QCborValue *)&local_38);
    QCborValue::~QCborValue((QCborValue *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void appendVariant(QCborContainerPrivate *d, const QVariant &variant)
{
    // Handle strings and byte arrays directly, to avoid creating a temporary
    // dummy container to hold their data.
    int type = variant.metaType().id();
    if (type == QMetaType::QString) {
        d->append(variant.toString());
    } else if (type == QMetaType::QByteArray) {
        QByteArray ba = variant.toByteArray();
        d->appendByteData(ba.constData(), ba.size(), QCborValue::ByteArray);
    } else {
        // For everything else, use the function below.
        d->append(QCborValue::fromVariant(variant));
    }
}